

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta)

{
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  long lVar1;
  int *piVar2;
  bool bVar3;
  long lVar4;
  row_iterator prVar5;
  rc_data *prVar6;
  rc_data *__first;
  long lVar7;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_90;
  int local_8c;
  rc_size local_88;
  float local_7c;
  float local_78;
  float local_74;
  bit_array *local_70;
  pair<int,_int> *local_68;
  rc_data *local_60;
  solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
  *local_58;
  undefined8 local_50;
  pair<int,_int> *local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  row_iterator local_38;
  
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  local_7c = theta;
  local_78 = delta;
  local_74 = kappa;
  local_70 = x;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_74,&local_78,&local_7c);
  if (first._M_current == last._M_current) {
    local_50 = 0;
  }
  else {
    local_58 = this + 0x10;
    local_50 = 0;
    local_68 = last._M_current;
    do {
      local_90 = (first._M_current)->first;
      local_48 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)local_58);
      if (local_38 != (row_iterator)local_40._M_head_impl) {
        lVar4 = *(long *)(this + 0x50);
        prVar5 = local_38;
        do {
          piVar2 = &prVar5->value;
          prVar5 = prVar5 + 1;
          *(float *)(lVar4 + (long)*piVar2 * 4) = local_7c * *(float *)(lVar4 + (long)*piVar2 * 4);
        } while (prVar5 != (row_iterator)local_40._M_head_impl);
      }
      local_88 = solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                             *)this,local_38,(row_iterator)local_40._M_head_impl,local_70);
      if (1 < local_88.r_size) {
        lVar4 = (long)local_88.r_size;
        __first = *(rc_data **)(this + 0x68);
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        prVar6 = __first + lVar4;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar6,(int)LZCOUNT(lVar4) * 2 ^ 0x7e);
        local_60 = prVar6;
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar6);
        lVar4 = lVar4 * 0xc + -0xc;
        prVar6 = __first;
        do {
          prVar6 = prVar6 + 1;
          if ((__first->value != prVar6->value) || (NAN(__first->value) || NAN(prVar6->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar6,__g);
            __first = prVar6;
          }
          lVar4 = lVar4 + -0xc;
        } while (lVar4 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,local_60,__g);
        last._M_current = local_68;
      }
      local_8c = solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                 ::select_variables((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                                     *)this,&local_88,
                                    *(int *)(*(long *)(this + 0x70) + (long)local_90 * 0xc),
                                    *(int *)(*(long *)(this + 0x70) + 4 + (long)local_90 * 0xc));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_90,
                 (int *)((long)local_90 * 0xc + *(long *)(this + 0x70)));
      if (0 < local_88.r_size) {
        lVar4 = 8;
        lVar7 = 0;
        do {
          lVar1 = *(long *)(this + 0x68);
          fmt_01._M_str = "{} ({} {}) ";
          fmt_01._M_len = 0xb;
          debug_logger<true>::log<int,float,int>
                    ((debug_logger<true> *)this,fmt_01,(int *)(lVar1 + -4 + lVar4),
                     (float *)(lVar1 + -8 + lVar4),(int *)(lVar1 + lVar4));
          lVar7 = lVar7 + 1;
          lVar4 = lVar4 + 0xc;
        } while (lVar7 < local_88.r_size);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x70) + 4 + (long)local_90 * 0xc),&local_8c);
      bVar3 = affect<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                          *)this,local_70,local_38,local_90,local_8c,local_88.r_size,local_74,
                         local_78);
      local_50 = CONCAT71((int7)((ulong)local_50 >> 8),(byte)local_50 | bVar3);
      first._M_current = local_48 + 1;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)local_50 & 1);
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }